

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

string * testing::PrintToString<GMM_TILE_MODE_ENUM>
                   (string *__return_storage_ptr__,GMM_TILE_MODE_ENUM *value)

{
  long in_FS_OFFSET;
  ostream *local_1c0;
  GMM_TILE_MODE_ENUM *value_local;
  stringstream local_198 [8];
  stringstream ss;
  ostream aoStack_188 [376];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::stringstream::stringstream(local_198);
  local_1c0 = (ostream *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x198) {
    local_1c0 = aoStack_188;
  }
  internal::UniversalTersePrinter<GMM_TILE_MODE_ENUM>::Print(value,local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

::std::string PrintToString(const T& value) {
        ::std::stringstream ss;
        internal::UniversalTersePrinter<T>::Print(value, &ss);
        return ss.str();
    }